

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

void __thiscall
icu_63::MatchInfo::MatchInfo
          (MatchInfo *this,UTimeZoneNameType nameType,int32_t matchLength,UnicodeString *tzID,
          UnicodeString *mzID)

{
  UnicodeString *mzID_local;
  UnicodeString *tzID_local;
  int32_t matchLength_local;
  UTimeZoneNameType nameType_local;
  MatchInfo *this_local;
  
  UnicodeString::UnicodeString(&this->id);
  this->nameType = nameType;
  this->matchLength = matchLength;
  if (tzID == (UnicodeString *)0x0) {
    UnicodeString::setTo(&this->id,mzID);
    this->isTZID = '\0';
  }
  else {
    UnicodeString::setTo(&this->id,tzID);
    this->isTZID = '\x01';
  }
  return;
}

Assistant:

MatchInfo(UTimeZoneNameType nameType, int32_t matchLength, const UnicodeString* tzID, const UnicodeString* mzID) {
        this->nameType = nameType;
        this->matchLength = matchLength;
        if (tzID != NULL) {
            this->id.setTo(*tzID);
            this->isTZID = TRUE;
        } else {
            this->id.setTo(*mzID);
            this->isTZID = FALSE;
        }
    }